

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCommon.h
# Opt level: O3

void __thiscall
ASTFinder<luna::Terminator,_FindName>::~ASTFinder(ASTFinder<luna::Terminator,_FindName> *this)

{
  pointer pcVar1;
  
  (this->super_Visitor)._vptr_Visitor = (_func_int **)&PTR__ASTFinder_00186c28;
  pcVar1 = (this->finder_).name_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->finder_).name_.field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

explicit ASTFinder(const FinderType &finder)
        : the_ast_node_(nullptr), finder_(finder) { }